

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAdapter.cpp
# Opt level: O1

void __thiscall
OpenMD::FluctuatingChargeAdapter::makeFluctuatingCharge
          (FluctuatingChargeAdapter *this,RealType chargeMass,RealType nValence,DoublePolynomial *vs
          )

{
  AtomType *this_00;
  bool bVar1;
  undefined1 local_b9;
  SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  RealType local_a8;
  RealType local_a0;
  shared_ptr<OpenMD::GenericData> local_98;
  FluctuatingAtypeParameters local_88;
  
  local_a8 = chargeMass;
  local_a0 = nValence;
  bVar1 = AtomType::hasProperty(this->at_,(string *)OpenMD::FQtypeID_abi_cxx11_);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)OpenMD::FQtypeID_abi_cxx11_);
  }
  local_88.slaterZeta = 0.0;
  local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_88.electronegativity = 0.0;
  local_88.hardness = 0.0;
  local_88.slaterN = 0;
  local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88.chargeMass = local_a8;
  local_88.isMetallic = true;
  local_88.usesSlaterIntramolecular = false;
  local_88.nValence = local_a0;
  local_88.nMobile = local_a0;
  local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88.vself.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)&local_88.vself,
              (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)vs);
  this_00 = this->at_;
  local_b8 = (SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>>,std::__cxx11::string_const&,OpenMD::FluctuatingAtypeParameters&>
            (&_Stack_b0,&local_b8,
             (allocator<OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>_> *)&local_b9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenMD::FQtypeID_abi_cxx11_,&local_88);
  local_98.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_b8->super_GenericData;
  local_98.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_b0._M_pi;
  local_b8 = (SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *)0x0;
  _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(this_00,&local_98);
  if (local_98.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_b0._M_pi);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)&local_88.vself);
  return;
}

Assistant:

void FluctuatingChargeAdapter::makeFluctuatingCharge(RealType chargeMass,
                                                       RealType nValence,
                                                       DoublePolynomial vs) {
    if (isFluctuatingCharge()) { at_->removeProperty(FQtypeID); }

    FluctuatingAtypeParameters fqParam {};

    fqParam.chargeMass               = chargeMass;
    fqParam.usesSlaterIntramolecular = false;

    // old-style EAMPoly has nV = nM
    fqParam.isMetallic = true;
    fqParam.nValence   = nValence;
    fqParam.nMobile    = nValence;

    fqParam.vself = vs;

    at_->addProperty(std::make_shared<FluctuatingAtypeData>(FQtypeID, fqParam));
  }